

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  _Hash_node_base *value;
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  PointerStringPair lowercase_key;
  first_type local_40;
  
  p_Var2 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      value = p_Var2[1]._M_nxt;
      if ((value != (_Hash_node_base *)0x0) && (*(char *)&value->_M_nxt == '\x02')) {
        if (((ulong)value->_M_nxt & 0x800) == 0) {
          p_Var1 = value + 4;
        }
        else {
          p_Var1 = value + 5;
          if ((second_type)value[5]._M_nxt == (second_type)0x0) {
            p_Var1 = value + 2;
          }
        }
        local_40.first = p_Var1->_M_nxt;
        stringpiece_internal::StringPiece::StringPiece
                  (&local_40.second,
                   *(char **)((second_type)value[1]._M_nxt +
                             ((*(byte *)((long)&value->_M_nxt + 3) & 3) << 5)));
        InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                  (&this->fields_by_lowercase_name_,&local_40,(second_type *)value);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal() const {
  for (Symbol symbol : symbols_by_parent_) {
    const FieldDescriptor* field = symbol.field_descriptor();
    if (!field) continue;
    PointerStringPair lowercase_key(FindParentForFieldsByMap(field),
                                    field->lowercase_name().c_str());
    InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);
  }
}